

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quake.cpp
# Opt level: O2

double __thiscall DEarthquake::GetModIntensity(DEarthquake *this,double intensity,bool fake)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  
  iVar3 = this->m_Countdown;
  iVar1 = this->m_CountdownStart;
  if (iVar1 < iVar3) {
    __assert_fail("m_CountdownStart >= m_Countdown",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_quake.cpp"
                  ,0xb0,"double DEarthquake::GetModIntensity(double, bool) const");
  }
  dVar7 = intensity + intensity;
  uVar2 = this->m_Flags;
  if ((uVar2 & 6) != 0) {
    iVar5 = this->m_Highpoint;
    iVar6 = iVar1 - iVar5;
    iVar4 = iVar1;
    if ((iVar6 != 0 && iVar1 >= iVar5) && iVar5 >= 1) {
      iVar4 = iVar5;
    }
    if ((uVar2 & 6) == 6) {
      if ((iVar6 == 0 || iVar1 < iVar5) || iVar5 < 1) {
        iVar4 = iVar1 - iVar3;
        iVar5 = iVar1;
        if ((uVar2 & 8) == 0) {
          if (iVar4 <= iVar3) {
            iVar3 = iVar4;
          }
        }
        else if (iVar3 <= iVar4) {
          iVar3 = iVar4;
        }
      }
      else {
        iVar1 = this->m_MiniCount;
        if (iVar1 < 1) {
          iVar5 = iVar6;
          if ((uVar2 & 8) != 0) {
            iVar3 = iVar6 - iVar3;
          }
        }
        else {
          iVar3 = iVar5 - iVar1;
          if ((uVar2 & 8) != 0) {
            iVar3 = iVar1;
          }
        }
      }
      if (iVar5 <= iVar3) {
        iVar3 = iVar5;
      }
      if (!fake) {
        iVar3 = iVar3 << ((byte)uVar2 >> 4 & 1);
      }
    }
    else {
      if ((((uVar2 & 2) == 0) && (iVar3 = iVar1 - iVar3, 0 < iVar5)) &&
         (iVar3 = iVar5 - this->m_MiniCount, iVar4 <= iVar3)) {
        iVar3 = iVar4;
      }
      iVar5 = iVar4;
      if (iVar4 <= iVar3) {
        iVar3 = iVar4;
      }
    }
    if (iVar5 < 1) {
      __assert_fail("divider > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_quake.cpp"
                    ,0xe8,"double DEarthquake::GetModIntensity(double, bool) const");
    }
    dVar7 = (dVar7 * (double)iVar3) / (double)iVar5;
  }
  return dVar7;
}

Assistant:

double DEarthquake::GetModIntensity(double intensity, bool fake) const
{
	assert(m_CountdownStart >= m_Countdown);

	intensity += intensity;		// always doubled

	if (m_Flags & (QF_SCALEDOWN | QF_SCALEUP))
	{
		// Adjustable maximums must use a range between 1 and m_CountdownStart to constrain between no quake and full quake.
		bool check = !!(m_Highpoint > 0 && m_Highpoint < m_CountdownStart);
		int divider = (check) ? m_Highpoint : m_CountdownStart;
		int scalar;
		
		if ((m_Flags & (QF_SCALEDOWN | QF_SCALEUP)) == (QF_SCALEDOWN | QF_SCALEUP))
		{
			if (check)
			{
				if (m_MiniCount > 0)
					scalar = (m_Flags & QF_MAX) ? m_MiniCount : (m_Highpoint - m_MiniCount);
				else
				{
					divider = m_CountdownStart - m_Highpoint;
					scalar = (m_Flags & QF_MAX) ? (divider - m_Countdown) : m_Countdown;
				}
			}
			else
			{
				// Defaults to middle of the road.
				divider = m_CountdownStart;
				scalar = (m_Flags & QF_MAX) ? MAX(m_Countdown, m_CountdownStart - m_Countdown)
					: MIN(m_Countdown, m_CountdownStart - m_Countdown);
			}
			scalar = (scalar > divider) ? divider : scalar;

			if (!fake && (m_Flags & QF_FULLINTENSITY))
			{
				scalar *= 2;
			}
		}
		else 
		{
			if (m_Flags & QF_SCALEDOWN)
			{
				scalar = m_Countdown;
			}
			else			// QF_SCALEUP
			{ 
				scalar = m_CountdownStart - m_Countdown;
				if (m_Highpoint > 0)
				{
					if ((m_Highpoint - m_MiniCount) < divider)
						scalar = m_Highpoint - m_MiniCount;
					else
						scalar = divider;
				}
			}
			scalar = (scalar > divider) ? divider : scalar;			
		}		
		assert(divider > 0);
		intensity = intensity * scalar / divider;
	}
	return intensity;
}